

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O2

void __thiscall
opengv::absolute_pose::modules::Epnp::find_betas_approx_2
          (Epnp *this,Matrix<double,_6,_10,_0,_6,_10> *L_6x10,Matrix<double,_6,_1,_0,_6,_1> *Rho,
          double *betas)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double *pdVar4;
  long lVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  VectorXd b3;
  VectorXd Rho_temp;
  MatrixXd L_6x3;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *local_250;
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *local_248;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD;
  
  SVD.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.m_matrixU.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data._0_4_ = 6;
  Rho_temp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data._0_4_ = 3
  ;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&L_6x3,(int *)&SVD,(int *)&Rho_temp);
  lVar5 = 6;
  pdVar4 = L_6x3.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
  while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
    *pdVar4 = *(double *)L_6x10;
    pdVar4[L_6x3.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows]
         = *(double *)((long)L_6x10 + 0x30);
    pdVar1 = (double *)((long)L_6x10 + 0x60);
    L_6x10 = (Matrix<double,_6,_10,_0,_6,_10> *)((long)L_6x10 + 8);
    pdVar4[L_6x3.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
           2] = *pdVar1;
    pdVar4 = pdVar4 + 1;
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD(&SVD,&L_6x3,0x14);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&Rho_temp,
             (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)Rho);
  local_250 = &SVD;
  local_248 = (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&Rho_temp;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Solve<Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_1,_1,0,_1,_1>,2>>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&b3,
             (DenseBase<Eigen::Solve<Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_250);
  dVar9 = *b3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar9;
  if (0.0 <= dVar9) {
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
    }
    else {
      auVar8 = vsqrtsd_avx(auVar8,auVar8);
      dVar9 = auVar8._0_8_;
    }
    *betas = dVar9;
    dVar9 = 0.0;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = b3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data[2];
    if (b3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[2] <= 0.0
       ) goto LAB_00237fd4;
  }
  else {
    auVar12._0_8_ = -dVar9;
    auVar12._8_8_ = 0x8000000000000000;
    if (-0.0 < dVar9) {
      dVar9 = sqrt(auVar12._0_8_);
    }
    else {
      auVar8 = vsqrtsd_avx(auVar12,auVar12);
      dVar9 = auVar8._0_8_;
    }
    *betas = dVar9;
    dVar9 = 0.0;
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         b3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[2];
    if (0.0 <= b3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[2]
       ) goto LAB_00237fd4;
    auVar2._8_8_ = 0x8000000000000000;
    auVar2._0_8_ = 0x8000000000000000;
    auVar7 = vxorpd_avx512vl(auVar10,auVar2);
  }
  if (auVar7._0_8_ < 0.0) {
    dVar9 = sqrt(auVar7._0_8_);
  }
  else {
    auVar8 = vsqrtsd_avx(auVar7,auVar7);
    dVar9 = auVar8._0_8_;
  }
LAB_00237fd4:
  betas[1] = dVar9;
  if (b3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[1] < 0.0) {
    auVar11._8_8_ = 0;
    auVar11._0_8_ = *betas;
    auVar3._8_8_ = 0x8000000000000000;
    auVar3._0_8_ = 0x8000000000000000;
    auVar8 = vxorpd_avx512vl(auVar11,auVar3);
    dVar9 = (double)vmovlpd_avx(auVar8);
    *betas = dVar9;
  }
  betas[2] = 0.0;
  betas[3] = 0.0;
  Eigen::internal::handmade_aligned_free
            (b3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            ((void *)CONCAT44(Rho_temp.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data._4_4_,
                              Rho_temp.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data._0_4_));
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&SVD);
  Eigen::internal::handmade_aligned_free
            (L_6x3.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
            );
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::find_betas_approx_2(
    const Eigen::Matrix<double,6,10> & L_6x10,
    const Eigen::Matrix<double,6,1> & Rho,
    double * betas)
{
  Eigen::MatrixXd L_6x3(6,3);

  for(int i = 0; i < 6; i++)
  {
    L_6x3(i,0) = L_6x10(i,0);
    L_6x3(i,1) = L_6x10(i,1);
    L_6x3(i,2) = L_6x10(i,2);
  }

  Eigen::JacobiSVD<Eigen::MatrixXd> SVD(
      L_6x3,
      Eigen::ComputeFullV | Eigen::ComputeFullU);
  Eigen::VectorXd Rho_temp = Rho;
  Eigen::VectorXd b3 = SVD.solve(Rho_temp);

  if (b3[0] < 0)
  {
    betas[0] = sqrt(-b3[0]);
    betas[1] = (b3[2] < 0) ? sqrt(-b3[2]) : 0.0;
  }
  else
  {
    betas[0] = sqrt(b3[0]);
    betas[1] = (b3[2] > 0) ? sqrt(b3[2]) : 0.0;
  }

  if (b3[1] < 0) betas[0] = -betas[0];

  betas[2] = 0.0;
  betas[3] = 0.0;
}